

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::MergeStorage
          (RowGroupCollection *this,RowGroupCollection *data,
          optional_ptr<duckdb::DataTable,_true> table,
          optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  __int_type _Var1;
  pointer pSVar2;
  pointer __p;
  bool bVar3;
  RowGroupSegmentTree *pRVar4;
  type this_00;
  pointer pRVar5;
  pointer this_01;
  StorageCommitState *pSVar6;
  DataTable *pDVar7;
  pointer pSVar8;
  idx_t iVar9;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *this_02;
  unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
  row_group_data;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> segments;
  PersistentRowGroupData persistent_data;
  ulong local_e0;
  _Head_base<0UL,_duckdb::PersistentCollectionData_*,_false> local_d8;
  RowGroupCollection *local_d0;
  optional_ptr<duckdb::StorageCommitState,_true> local_c8;
  RowGroupCollection *local_c0;
  idx_t local_b8;
  unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
  local_b0;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_a8;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  local_a0;
  vector<duckdb::LogicalType,_true> *local_88;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_80;
  optional_ptr<duckdb::DataTable,_true> local_78;
  PersistentRowGroupData local_70;
  
  iVar9 = this->row_start;
  _Var1 = (this->total_rows).super___atomic_base<unsigned_long>._M_i;
  local_d0 = this;
  local_c8.ptr = commit_state.ptr;
  local_c0 = data;
  local_78.ptr = table.ptr;
  pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&data->row_groups);
  SegmentTree<duckdb::RowGroup,_true>::MoveSegments
            ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)&local_a0,
             &pRVar4->super_SegmentTree<duckdb::RowGroup,_true>);
  pSVar2 = local_a0.
           super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d8._M_head_impl = (PersistentCollectionData *)0x0;
  if (local_c8.ptr != (StorageCommitState *)0x0) {
    local_e0 = 0;
    for (pSVar8 = local_a0.
                  super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar2; pSVar8 = pSVar8 + 1)
    {
      this_00 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                          (&pSVar8->node);
      bVar3 = RowGroup::IsPersistent(this_00);
      if (!bVar3) break;
      local_e0 = local_e0 +
                 (this_00->super_SegmentBase<duckdb::RowGroup>).count.
                 super___atomic_base<unsigned_long>._M_i;
    }
    if (local_e0 != 0) {
      make_uniq<duckdb::PersistentCollectionData>();
      __p = local_70.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
      local_70.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
      ::reset((__uniq_ptr_impl<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
               *)&local_d8,(pointer)__p);
      ::std::
      unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
      ::~unique_ptr((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
                     *)&local_70);
      goto LAB_0052fd6e;
    }
  }
  local_e0 = 0;
LAB_0052fd6e:
  iVar9 = _Var1 + iVar9;
  local_88 = &local_d0->types;
  local_80 = &local_d0->row_groups;
  local_b8 = iVar9;
  for (this_02 = &(local_a0.
                   super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->node;
      (SegmentNode<duckdb::RowGroup> *)(this_02 + -1) !=
      local_a0.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_02 = this_02 + 2) {
    pRVar5 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       (this_02);
    RowGroup::MoveToCollection(pRVar5,local_d0,iVar9);
    if ((local_c8.ptr != (StorageCommitState *)0x0) && (iVar9 - local_b8 < local_e0)) {
      pRVar5 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         (this_02);
      RowGroup::SerializeRowGroupInfo(&local_70,pRVar5);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70,
                 &local_88->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
      ;
      this_01 = unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                ::operator->((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                              *)&local_d8);
      ::std::vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
      ::emplace_back<duckdb::PersistentRowGroupData>
                ((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                  *)this_01,&local_70);
      PersistentRowGroupData::~PersistentRowGroupData(&local_70);
    }
    pRVar5 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       (this_02);
    _Var1 = (pRVar5->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
            _M_i;
    pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_80);
    local_a8._M_head_impl =
         (this_02->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
         super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
    (this_02->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
    super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
    super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&pRVar4->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_a8);
    iVar9 = iVar9 + _Var1;
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_a8);
  }
  if ((local_e0 != 0) && (local_c8.ptr != (StorageCommitState *)0x0)) {
    pSVar6 = optional_ptr<duckdb::StorageCommitState,_true>::operator->(&local_c8);
    pDVar7 = optional_ptr<duckdb::DataTable,_true>::operator*(&local_78);
    local_b0._M_t.
    super___uniq_ptr_impl<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PersistentCollectionData_*,_std::default_delete<duckdb::PersistentCollectionData>_>
    .super__Head_base<0UL,_duckdb::PersistentCollectionData_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true,_true>
          )(__uniq_ptr_data<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true,_true>
            )local_d8._M_head_impl;
    local_d8._M_head_impl = (PersistentCollectionData *)0x0;
    (*pSVar6->_vptr_StorageCommitState[4])(pSVar6,pDVar7,local_b8,local_e0);
    ::std::
    unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
    ::~unique_ptr(&local_b0);
  }
  TableStatistics::MergeStats(&local_d0->stats,&local_c0->stats);
  LOCK();
  (local_d0->total_rows).super___atomic_base<unsigned_long>._M_i =
       (local_d0->total_rows).super___atomic_base<unsigned_long>._M_i +
       (local_c0->total_rows).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  ::std::
  unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
  ::~unique_ptr((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>_>
                 *)&local_d8);
  ::std::
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ::~vector(&local_a0);
  return;
}

Assistant:

void RowGroupCollection::MergeStorage(RowGroupCollection &data, optional_ptr<DataTable> table,
                                      optional_ptr<StorageCommitState> commit_state) {
	D_ASSERT(data.types == types);
	auto start_index = row_start + total_rows.load();
	auto index = start_index;
	auto segments = data.row_groups->MoveSegments();

	// check if the row groups we are merging are optimistically written
	// if all row groups are optimistically written we keep around the block pointers
	unique_ptr<PersistentCollectionData> row_group_data;
	idx_t optimistically_written_count = 0;
	if (commit_state) {
		for (auto &entry : segments) {
			auto &row_group = *entry.node;
			if (!row_group.IsPersistent()) {
				break;
			}
			optimistically_written_count += row_group.count;
		}
		if (optimistically_written_count > 0) {
			row_group_data = make_uniq<PersistentCollectionData>();
		}
	}
	for (auto &entry : segments) {
		auto &row_group = entry.node;
		row_group->MoveToCollection(*this, index);

		if (commit_state && (index - start_index) < optimistically_written_count) {
			// serialize the block pointers of this row group
			auto persistent_data = row_group->SerializeRowGroupInfo();
			persistent_data.types = types;
			row_group_data->row_group_data.push_back(std::move(persistent_data));
		}
		index += row_group->count;
		row_groups->AppendSegment(std::move(row_group));
	}
	if (commit_state && optimistically_written_count > 0) {
		// if we have serialized the row groups - push the serialized block pointers into the commit state
		commit_state->AddRowGroupData(*table, start_index, optimistically_written_count, std::move(row_group_data));
	}
	stats.MergeStats(data.stats);
	total_rows += data.total_rows.load();
}